

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O2

err_t dstuParamsStd(dstu_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  octet *poVar3;
  size_t count;
  size_t sStack_20;
  
  bVar1 = memIsValid(params,0x110);
  if (bVar1 == 0) {
    return 0x6d;
  }
  memSet(params,'\0',0x110);
  iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.0");
  if (iVar2 == 0) {
    memCopy(params,_curve163pb_p,8);
    params->A = '\x01';
    memCopy(params->B,_curve163pb_B,0x15);
    memCopy(params->n,_curve163pb_n,0x15);
    params->c = 2;
    memCopy(params->P,_curve163pb_P,0x2a);
    return 0;
  }
  iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.1");
  if (iVar2 == 0) {
    memCopy(params,_curve167pb_p,8);
    params->A = '\x01';
    count = 0x15;
    memCopy(params->B,_curve167pb_B,0x15);
    poVar3 = _curve167pb_n;
  }
  else {
    iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.2");
    if (iVar2 == 0) {
      memCopy(params,_curve173pb_p,8);
      params->A = '\0';
      sStack_20 = 0x16;
      memCopy(params->B,_curve173pb_B,0x16);
      poVar3 = _curve173pb_n;
LAB_0013d195:
      memCopy(params->n,poVar3,sStack_20);
      params->c = 4;
      return 0;
    }
    iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.3");
    if (iVar2 == 0) {
      memCopy(params,_curve179pb_p,8);
      params->A = '\x01';
      count = 0x17;
      memCopy(params->B,_curve179pb_B,0x17);
      poVar3 = _curve179pb_n;
    }
    else {
      iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.4");
      if (iVar2 == 0) {
        memCopy(params,_curve191pb_p,8);
        params->A = '\x01';
        count = 0x18;
        memCopy(params->B,_curve191pb_B,0x18);
        poVar3 = _curve191pb_n;
      }
      else {
        iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.5");
        if (iVar2 == 0) {
          memCopy(params,_curve233pb_p,8);
          params->A = '\x01';
          count = 0x1e;
          memCopy(params->B,_curve233pb_B,0x1e);
          poVar3 = _curve233pb_n;
        }
        else {
          iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.6");
          if (iVar2 == 0) {
            memCopy(params,_curve257pb_p,8);
            params->A = '\0';
            memCopy(params->B,_curve257pb_B,0x21);
            poVar3 = _curve257pb_n;
            sStack_20 = 0x20;
            goto LAB_0013d195;
          }
          iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.7");
          if (iVar2 == 0) {
            memCopy(params,_curve307pb_p,8);
            params->A = '\x01';
            count = 0x27;
            memCopy(params->B,_curve307pb_B,0x27);
            poVar3 = _curve307pb_n;
          }
          else {
            iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.8");
            if (iVar2 == 0) {
              memCopy(params,_curve367pb_p,8);
              params->A = '\x01';
              count = 0x2e;
              memCopy(params->B,_curve367pb_B,0x2e);
              poVar3 = _curve367pb_n;
            }
            else {
              iVar2 = strCmp(name,"1.2.804.2.1.1.1.1.3.1.1.1.2.9");
              if (iVar2 != 0) {
                return 0xca;
              }
              memCopy(params,_curve431pb_p,8);
              params->A = '\x01';
              count = 0x36;
              memCopy(params->B,_curve431pb_B,0x36);
              poVar3 = _curve431pb_n;
            }
          }
        }
      }
    }
  }
  memCopy(params->n,poVar3,count);
  params->c = 2;
  return 0;
}

Assistant:

err_t dstuParamsStd(dstu_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(dstu_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(dstu_params));
	if (strEq(name, _curve163pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve163pb);
		memCopy(params->P, _curve163pb_P, sizeof(_curve163pb_P));
		return ERR_OK;
	}
	if (strEq(name, _curve167pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve167pb);
		return ERR_OK;
	}
	if (strEq(name, _curve173pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve173pb);
		return ERR_OK;
	}
	if (strEq(name, _curve179pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve179pb);
		return ERR_OK;
	}
	if (strEq(name, _curve191pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve191pb);
		return ERR_OK;
	}
	if (strEq(name, _curve233pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve233pb);
		return ERR_OK;
	}
	if (strEq(name, _curve257pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve257pb);
		return ERR_OK;
	}
	if (strEq(name, _curve307pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve307pb);
		return ERR_OK;
	}
	if (strEq(name, _curve367pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve367pb);
		return ERR_OK;
	}
	if (strEq(name, _curve431pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve431pb);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}